

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  Expression *args_1;
  bool bVar2;
  ulong uVar3;
  ExpressionSyntax *pEVar4;
  Expression *args_2;
  Expression *args_3;
  Type *args;
  MinTypMaxExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  Expression *selected;
  Expression *local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  SourceRange local_40;
  
  uVar3 = (ulong)(compilation->options).minTypMax;
  if (uVar3 < 3) {
    extraFlags.m_bits = *(underlying_type *)(&DAT_0038a300 + uVar3 * 8);
    local_48.m_bits = *(underlying_type *)(&DAT_0038a318 + uVar3 * 8);
    extraFlags_00.m_bits = *(underlying_type *)(&DAT_0038a330 + uVar3 * 8);
  }
  else {
    extraFlags.m_bits = 2;
    local_48.m_bits = 2;
    extraFlags_00.m_bits = extraFlags.m_bits;
  }
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->min);
  local_50 = Expression::create(compilation,pEVar4,context,extraFlags_00,assignmentTarget);
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->typ);
  args_2 = Expression::create(compilation,pEVar4,context,local_48,assignmentTarget);
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->max);
  args_3 = Expression::create(compilation,pEVar4,context,extraFlags,assignmentTarget);
  args_1 = local_50;
  MVar1 = (compilation->options).minTypMax;
  selected = args_3;
  if ((MVar1 != Max) && (selected = args_2, MVar1 != Typ)) {
    selected = local_50;
  }
  args = not_null<const_slang::ast::Type_*>::get(&selected->type);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,args_1,args_2,args_3,&selected,&local_40)
  ;
  bVar2 = Expression::bad(args_1);
  if (((bVar2) || (bVar2 = Expression::bad(args_2), bVar2)) ||
     (bVar2 = Expression::bad(args_3), bVar2)) {
    expr = (MinTypMaxExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}